

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  bool bVar1;
  UnitTest *pUVar2;
  TestEventListeners *this_00;
  TimeInMillis TVar3;
  Test *this_01;
  Test *test;
  Timer timer;
  TestEventListener *repeater;
  TestInfo *this_local;
  
  pUVar2 = UnitTest::GetInstance();
  this_00 = UnitTest::listeners(pUVar2);
  timer.start_.__d.__r = (time_point)TestEventListeners::repeater(this_00);
  if ((this->should_run_ & 1U) == 0) {
    if (((this->is_disabled_ & 1U) != 0) && ((this->matches_filter_ & 1U) != 0)) {
      (*(*(_func_int ***)timer.start_.__d.__r)[9])(timer.start_.__d.__r,this);
    }
  }
  else {
    pUVar2 = UnitTest::GetInstance();
    UnitTest::set_current_test_info(pUVar2,this);
    (**(code **)(*(long *)timer.start_.__d.__r + 0x40))(timer.start_.__d.__r,this);
    TVar3 = internal::GetTimeInMillis();
    TestResult::set_start_timestamp(&this->result_,TVar3);
    internal::Timer::Timer((Timer *)&test);
    pUVar2 = UnitTest::GetInstance();
    UnitTest::UponLeavingGTest(pUVar2);
    this_01 = internal::
              HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                        (this->factory_,0x11,(char *)0x0);
    bVar1 = Test::HasFatalFailure();
    if ((!bVar1) && (bVar1 = Test::IsSkipped(), !bVar1)) {
      Test::Run(this_01);
    }
    if (this_01 != (Test *)0x0) {
      pUVar2 = UnitTest::GetInstance();
      UnitTest::UponLeavingGTest(pUVar2);
      internal::HandleExceptionsInMethodIfSupported<testing::Test,void>
                (this_01,0x163920,(char *)0x0);
    }
    TVar3 = internal::Timer::Elapsed((Timer *)&test);
    TestResult::set_elapsed_time(&this->result_,TVar3);
    (**(code **)(*(long *)timer.start_.__d.__r + 0x58))(timer.start_.__d.__r,this);
    pUVar2 = UnitTest::GetInstance();
    UnitTest::set_current_test_info(pUVar2,(TestInfo *)0x0);
  }
  return;
}

Assistant:

void TestInfo::Run() {
  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();
  if (!should_run_) {
    if (is_disabled_ && matches_filter_) repeater->OnTestDisabled(*this);
    return;
  }

  // Tells UnitTest where to store test result.
  UnitTest::GetInstance()->set_current_test_info(this);

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);
  result_.set_start_timestamp(internal::GetTimeInMillis());
  internal::Timer timer;
  UnitTest::GetInstance()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test if the constructor didn't generate a fatal failure or invoke
  // GTEST_SKIP().
  // Note that the object will not be null
  if (!Test::HasFatalFailure() && !Test::IsSkipped()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

  if (test != nullptr) {
    // Deletes the test object.
    UnitTest::GetInstance()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        test, &Test::DeleteSelf_, "the test fixture's destructor");
  }

  result_.set_elapsed_time(timer.Elapsed());

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  UnitTest::GetInstance()->set_current_test_info(nullptr);
}